

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O0

void mergesort_3way_unstable(uchar **strings,size_t n,uchar **tmp)

{
  ostream *poVar1;
  ulong n_00;
  ulong uVar2;
  size_t split1;
  size_t split0;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"mergesort_3way_unstable");
  poVar1 = std::operator<<(poVar1,"(), n=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
  std::operator<<(poVar1,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,0);
  }
  else {
    n_00 = n / 3;
    uVar2 = (n << 1) / 3;
    mergesort_3way_unstable(strings,n_00,tmp);
    mergesort_3way_unstable(strings + n_00,uVar2 - n_00,tmp);
    mergesort_3way_unstable(strings + uVar2,n - uVar2,tmp);
    merge_3way_unstable(strings,n_00,strings + n_00,uVar2 - n_00,strings + uVar2,n - uVar2,tmp);
    memcpy(strings,tmp,n << 3);
  }
  return;
}

Assistant:

static void
mergesort_3way_unstable(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/3, split1 = (2*n)/3;
	mergesort_3way_unstable(strings,        split0,        tmp);
	mergesort_3way_unstable(strings+split0, split1-split0, tmp);
	mergesort_3way_unstable(strings+split1, n-split1,      tmp);
	merge_3way_unstable(strings, split0,
	                    strings+split0, split1-split0,
	                    strings+split1, n-split1,
	                    tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}